

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::ComputeOutputDir
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *out)

{
  size_type sVar1;
  cmGlobalGenerator *pcVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  int iVar5;
  TargetType TVar6;
  char *pcVar7;
  cmValue cVar8;
  string *in_base;
  string suffix;
  string conf;
  string targetTypeName;
  string configUpper;
  string propertyName;
  string configProp;
  allocator<char> local_149;
  string local_148;
  string local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_108,(string *)config);
  pcVar7 = GetOutputTargetType(this,artifact);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,pcVar7,(allocator<char> *)&local_a8);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  if (local_e8._M_string_length != 0) {
    cmStrCat<std::__cxx11::string&,char_const(&)[18]>(&local_c8,&local_e8,(char (*) [18])0x68bd23);
    std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  cmsys::SystemTools::UpperCase(&local_c8,&local_108);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  if (local_e8._M_string_length != 0) {
    cmStrCat<std::__cxx11::string&,char_const(&)[19],std::__cxx11::string&>
              (&local_148,&local_e8,(char (*) [19])0x69a861,&local_c8);
    std::__cxx11::string::operator=((string *)&local_88,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
  }
  cVar8 = GetProperty(this,&local_88);
  if (cVar8.Value == (string *)0x0) {
    cVar8 = GetProperty(this,&local_a8);
    if (cVar8.Value == (string *)0x0) {
      TVar6 = GetType(this);
      if (TVar6 == EXECUTABLE) {
        pcVar3 = this->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_148,"EXECUTABLE_OUTPUT_PATH",(allocator<char> *)&local_128);
        cmMakefile::GetSafeDefinition(pcVar3,&local_148);
        std::__cxx11::string::_M_assign((string *)out);
      }
      else {
        TVar6 = GetType(this);
        if (((TVar6 != STATIC_LIBRARY) && (TVar6 = GetType(this), TVar6 != SHARED_LIBRARY)) &&
           (TVar6 = GetType(this), TVar6 != MODULE_LIBRARY)) goto LAB_003f9b35;
        pcVar3 = this->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_148,"LIBRARY_OUTPUT_PATH",(allocator<char> *)&local_128);
        cmMakefile::GetSafeDefinition(pcVar3,&local_148);
        std::__cxx11::string::_M_assign((string *)out);
      }
      std::__cxx11::string::~string((string *)&local_148);
      goto LAB_003f9b35;
    }
    std::__cxx11::string::string((string *)&local_68,(string *)cVar8.Value);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    local_128._M_string_length = 0;
    local_128.field_2._M_local_buf[0] = '\0';
    cmGeneratorExpression::Evaluate
              (&local_148,&local_68,this->LocalGenerator,config,this,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_128);
    std::__cxx11::string::operator=((string *)out,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_68);
    bVar4 = std::operator!=(out,cVar8.Value);
    if (!bVar4) goto LAB_003f9b35;
  }
  else {
    std::__cxx11::string::string((string *)&local_48,(string *)cVar8.Value);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    local_128._M_string_length = 0;
    local_128.field_2._M_local_buf[0] = '\0';
    cmGeneratorExpression::Evaluate
              (&local_148,&local_48,this->LocalGenerator,config,this,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_128);
    std::__cxx11::string::operator=((string *)out,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_48);
  }
  local_108._M_string_length = 0;
  *local_108._M_dataplus._M_p = '\0';
LAB_003f9b35:
  sVar1 = out->_M_string_length;
  if (sVar1 == 0) {
    std::__cxx11::string::assign((char *)out);
  }
  in_base = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  cmsys::SystemTools::CollapseFullPath(&local_148,out,in_base);
  std::__cxx11::string::operator=((string *)out,(string *)&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  if (local_108._M_string_length != 0) {
    iVar5 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x31])
                      (this->GlobalGenerator,this->Makefile);
    pcVar7 = "${EFFECTIVE_PLATFORM_NAME}";
    if ((char)iVar5 == '\0') {
      pcVar7 = "";
    }
    if (sVar1 != 0) {
      pcVar7 = "";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,pcVar7,(allocator<char> *)&local_128);
    pcVar2 = this->LocalGenerator->GlobalGenerator;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"/",&local_149);
    (*pcVar2->_vptr_cmGlobalGenerator[0x1a])(pcVar2,&local_128,&local_108,&local_148,out);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
  }
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  return sVar1 == 0;
}

Assistant:

bool cmGeneratorTarget::ComputeOutputDir(const std::string& config,
                                         cmStateEnums::ArtifactType artifact,
                                         std::string& out) const
{
  bool usesDefaultOutputDir = false;
  std::string conf = config;

  // Look for a target property defining the target output directory
  // based on the target type.
  std::string targetTypeName = this->GetOutputTargetType(artifact);
  std::string propertyName;
  if (!targetTypeName.empty()) {
    propertyName = cmStrCat(targetTypeName, "_OUTPUT_DIRECTORY");
  }

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  std::string configProp;
  if (!targetTypeName.empty()) {
    configProp = cmStrCat(targetTypeName, "_OUTPUT_DIRECTORY_", configUpper);
  }

  // Select an output directory.
  if (cmValue config_outdir = this->GetProperty(configProp)) {
    // Use the user-specified per-configuration output directory.
    out = cmGeneratorExpression::Evaluate(*config_outdir, this->LocalGenerator,
                                          config, this);

    // Skip per-configuration subdirectory.
    conf.clear();
  } else if (cmValue outdir = this->GetProperty(propertyName)) {
    // Use the user-specified output directory.
    out = cmGeneratorExpression::Evaluate(*outdir, this->LocalGenerator,
                                          config, this);
    // Skip per-configuration subdirectory if the value contained a
    // generator expression.
    if (out != *outdir) {
      conf.clear();
    }
  } else if (this->GetType() == cmStateEnums::EXECUTABLE) {
    // Lookup the output path for executables.
    out = this->Makefile->GetSafeDefinition("EXECUTABLE_OUTPUT_PATH");
  } else if (this->GetType() == cmStateEnums::STATIC_LIBRARY ||
             this->GetType() == cmStateEnums::SHARED_LIBRARY ||
             this->GetType() == cmStateEnums::MODULE_LIBRARY) {
    // Lookup the output path for libraries.
    out = this->Makefile->GetSafeDefinition("LIBRARY_OUTPUT_PATH");
  }
  if (out.empty()) {
    // Default to the current output directory.
    usesDefaultOutputDir = true;
    out = ".";
  }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath(
    out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if (!conf.empty()) {
    bool useEPN =
      this->GlobalGenerator->UseEffectivePlatformName(this->Makefile);
    std::string suffix =
      usesDefaultOutputDir && useEPN ? "${EFFECTIVE_PLATFORM_NAME}" : "";
    this->LocalGenerator->GetGlobalGenerator()->AppendDirectoryForConfig(
      "/", conf, suffix, out);
  }

  return usesDefaultOutputDir;
}